

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* build_dom_tree(map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                 *__return_storage_ptr__,
                map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  _Rb_tree_header *p_Var1;
  undefined1 *__k;
  _Rb_tree_node_base *__args;
  pointer piVar2;
  int *piVar3;
  _Base_ptr p_Var4;
  mapped_type *this;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  _Self __tmp;
  vector<int,_std::allocator<int>_> v;
  vector<int,_std::allocator<int>_> v_1;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var5 = (dom->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(dom->_M_t)._M_impl.super__Rb_tree_header;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    __k = &p_Var5[1].field_0x4;
    p_Var7 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    if (p_Var7 != (_Base_ptr)0x0) {
      do {
        if (*(int *)__k <= (int)*(size_t *)(p_Var7 + 1)) {
          p_Var4 = p_Var7;
        }
        p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < *(int *)__k];
      } while (p_Var7 != (_Base_ptr)0x0);
    }
    p_Var8 = p_Var1;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
       (p_Var8 = (_Rb_tree_header *)p_Var4,
       *(int *)__k < (int)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
      p_Var8 = p_Var1;
    }
    __args = p_Var5 + 1;
    if (p_Var8 == p_Var1) {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (int *)0x0;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_48,(iterator)0x0,(int *)__args);
      local_68.first = *(int *)__k;
      std::vector<int,_std::allocator<int>_>::vector(&local_68.second,&local_48);
      std::
      _Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
      ::_M_insert_unique<std::pair<int_const,std::vector<int,std::allocator<int>>>>
                ((_Rb_tree<int,std::pair<int_const,std::vector<int,std::allocator<int>>>,std::_Select1st<std::pair<int_const,std::vector<int,std::allocator<int>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                  *)__return_storage_ptr__,&local_68);
      piVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (int *)0x0) {
        operator_delete(local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        piVar2 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,
                 (vector<int,_std::allocator<int>_> *)(p_Var8 + 1));
      if (local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_68,
                   (iterator)
                   local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,(int *)__args);
      }
      else {
        *local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = __args->_M_color;
        local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      this = std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)__k);
      std::vector<int,_std::allocator<int>_>::operator=
                (this,(vector<int,_std::allocator<int>_> *)&local_68);
      piVar2 = (pointer)CONCAT44(local_68._4_4_,local_68.first);
      piVar3 = local_68.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)piVar3 - (long)piVar2);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"*** desplay dominator tree ***",0x1e);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  for (p_Var5 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 7;
    poVar6 = (ostream *)std::ostream::operator<<(&std::cout,p_Var5[1]._M_color);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," child(s):",10);
    if (p_Var5[1]._M_left != p_Var5[1]._M_parent) {
      uVar9 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 7;
        std::ostream::operator<<(&std::cout,(&(p_Var5[1]._M_parent)->_M_color)[uVar9]);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent >> 2));
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

map<int, vector<int>> build_dom_tree(map<int, int> dom) {
  map<int, vector<int>> dom_tree;
  map<int, int>::iterator tr;
  for (tr = dom.begin(); tr != dom.end(); tr++) {
    map<int, vector<int>>::iterator dtr = dom_tree.find(tr->second);
    if (dtr == dom_tree.end()) {
      vector<int> v;
      v.push_back(tr->first);
      dom_tree.insert(map<int, vector<int>>::value_type(tr->second, v));
    } else {
      vector<int> v = dtr->second;
      v.push_back(tr->first);
      dom_tree[tr->second] = v;
    }
  }
  cout << endl << "*** desplay dominator tree ***" << endl;
  map<int, vector<int>>::iterator it;
  for (it = dom_tree.begin(); it != dom_tree.end(); it++) {
    cout << setw(7) << it->first << " child(s):";
    for (int i = 0; i < it->second.size(); i++) {
      cout << " " << setw(7) << it->second[i];
    }
    cout << endl;
  }
  return dom_tree;
}